

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O1

int VP8GetCostUV(VP8EncIterator *it,VP8ModeScore *rd)

{
  int iVar1;
  VP8Encoder *pVVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  int16_t (*paiVar9) [16];
  int16_t (*paiVar10) [16];
  int16_t (*paiVar11) [16];
  long lVar12;
  bool bVar13;
  VP8Residual res;
  VP8Residual local_60;
  
  pVVar2 = it->enc;
  VP8IteratorNzToBytes(it);
  local_60.coeff_type = 2;
  local_60.prob = (pVVar2->proba).coeffs[2];
  local_60.stats = (pVVar2->proba).stats[2];
  local_60.costs = (pVVar2->proba).remapped_costs[2];
  local_60.first = 0;
  paiVar9 = rd->uv_levels;
  piVar7 = it->top_nz + 4;
  iVar8 = 0;
  uVar4 = 0;
  do {
    uVar5 = 0;
    paiVar10 = paiVar9;
    do {
      uVar6 = uVar5 | uVar4 | 4;
      lVar12 = 0;
      paiVar11 = paiVar10;
      do {
        iVar3 = it->left_nz[uVar6];
        iVar1 = piVar7[lVar12];
        (*VP8SetResidualCoeffs)(*paiVar11,&local_60);
        iVar3 = (*VP8GetResidualCost)(iVar3 + iVar1,&local_60);
        iVar8 = iVar8 + iVar3;
        it->left_nz[uVar6] = (uint)~local_60.last >> 0x1f;
        piVar7[lVar12] = (uint)~local_60.last >> 0x1f;
        lVar12 = lVar12 + 1;
        paiVar11 = paiVar11 + 1;
      } while (lVar12 == 1);
      paiVar10 = paiVar10 + 2;
      bVar13 = uVar5 == 0;
      uVar5 = uVar5 + 1;
    } while (bVar13);
    piVar7 = piVar7 + 2;
    paiVar9 = paiVar9 + 4;
    bVar13 = uVar4 == 0;
    uVar4 = uVar4 + 2;
  } while (bVar13);
  return iVar8;
}

Assistant:

int VP8GetCostUV(VP8EncIterator* const it, const VP8ModeScore* const rd) {
  VP8Residual res;
  VP8Encoder* const enc = it->enc;
  int ch, x, y;
  int R = 0;

  VP8IteratorNzToBytes(it);  // re-import the non-zero context

  VP8InitResidual(0, 2, enc, &res);
  for (ch = 0; ch <= 2; ch += 2) {
    for (y = 0; y < 2; ++y) {
      for (x = 0; x < 2; ++x) {
        const int ctx = it->top_nz[4 + ch + x] + it->left_nz[4 + ch + y];
        VP8SetResidualCoeffs(rd->uv_levels[ch * 2 + x + y * 2], &res);
        R += VP8GetResidualCost(ctx, &res);
        it->top_nz[4 + ch + x] = it->left_nz[4 + ch + y] = (res.last >= 0);
      }
    }
  }
  return R;
}